

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>,true>
               (FractionalInteger *begin,
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               end,int param_3,uint param_4)

{
  undefined8 *puVar1;
  double dVar2;
  HighsInt HVar3;
  pointer ppVar4;
  void *pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  undefined8 uVar9;
  pointer ppVar10;
  pointer ppVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  double dVar15;
  pointer ppVar16;
  pointer *pppVar17;
  ulong uVar18;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var19;
  FractionalInteger *pFVar20;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var21;
  ulong uVar22;
  FractionalInteger *pFVar23;
  FractionalInteger *pFVar24;
  FractionalInteger *pFVar25;
  pointer ppVar26;
  long lVar27;
  FractionalInteger *pFVar28;
  pointer *pppVar29;
  pointer *pppVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar36;
  _Iter_comp_iter<std::less<FractionalInteger>_> __cmp;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined8 uStack_f4;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_e8;
  pointer ppStack_e0;
  double local_d0;
  FractionalInteger *local_c8;
  FractionalInteger *local_c0;
  uint local_b8;
  int local_b4;
  FractionalInteger *local_b0;
  FractionalInteger *local_a8;
  HighsInt local_9c;
  FractionalInteger *local_98;
  FractionalInteger *local_90;
  FractionalInteger *local_88;
  ulong local_80;
  pointer local_78;
  pointer ppStack_70;
  pointer local_68;
  pointer ppStack_60;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_50;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_48;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_40;
  pointer local_38;
  
  uVar22 = (long)end._M_current - (long)begin;
  local_b0 = end._M_current;
  if ((long)uVar22 < 0x540) {
    if ((char)param_4 == '\0') {
LAB_002edd14:
      if (begin + 1 == end._M_current || begin == end._M_current) {
        return;
      }
      pppVar29 = &begin[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar20 = begin + 1;
      do {
        pFVar28 = pFVar20;
        local_d0 = begin[1].score;
        if (begin->score <= local_d0 && local_d0 != begin->score) {
          local_108 = pFVar28->fractionality;
          uStack_100 = SUB84(pFVar28->row_ep_norm2,0);
          uStack_fc = (undefined4)((ulong)pFVar28->row_ep_norm2 >> 0x20);
          HVar3 = begin[1].basisIndex;
          local_e8._M_current =
               (FractionalInteger *)
               begin[1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          ppStack_e0 = begin[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          ppVar26 = begin[1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pppVar17 = pppVar29;
          do {
            pppVar30 = pppVar17;
            ppVar10 = pppVar30[-8];
            *(undefined8 *)((long)pppVar30 + -0x24) = *(undefined8 *)((long)pppVar30 + -0x5c);
            *(undefined8 *)((long)pppVar30 + -0x1c) = *(undefined8 *)((long)pppVar30 + -0x54);
            pppVar30[-6] = pppVar30[-0xd];
            pppVar30[-5] = pppVar30[-0xc];
            ppVar4 = ((_Vector_impl_data *)(pppVar30 + -2))->_M_start;
            ((_Vector_impl_data *)(pppVar30 + -2))->_M_start = pppVar30[-9];
            pppVar30[-1] = ppVar10;
            *pppVar30 = pppVar30[-7];
            pppVar30[-9] = (pointer)0x0;
            pppVar30[-8] = (pointer)0x0;
            pppVar30[-7] = (pointer)0x0;
            if (ppVar4 != (pointer)0x0) {
              operator_delete(ppVar4);
            }
            pppVar17 = pppVar30 + -7;
          } while ((double)pppVar30[-0x12] <= local_d0 && local_d0 != (double)pppVar30[-0x12]);
          pppVar30[-0xd] = (pointer)local_108;
          pppVar30[-0xc] = (pointer)CONCAT44(uStack_fc,uStack_100);
          pppVar30[-0xb] = (pointer)local_d0;
          *(HighsInt *)(pppVar30 + -10) = HVar3;
          pvVar5 = pppVar30[-9];
          pppVar30[-9] = (pointer)local_e8._M_current;
          pppVar30[-8] = ppStack_e0;
          pppVar30[-7] = ppVar26;
          end._M_current = local_b0;
          if (pvVar5 != (void *)0x0) {
            operator_delete(pvVar5);
            end._M_current = local_b0;
          }
        }
        pppVar29 = pppVar29 + 7;
        pFVar20 = pFVar28 + 1;
        begin = pFVar28;
      } while (pFVar28 + 1 != end._M_current);
      return;
    }
  }
  else {
    pFVar20 = end._M_current + -1;
    local_40 = &end._M_current[-1].row_ep;
    local_88 = end._M_current + -2;
    local_48 = &end._M_current[-2].row_ep;
    local_90 = end._M_current + -3;
    local_50 = &end._M_current[-3].row_ep;
    local_98 = pFVar20;
    do {
      uVar33 = (uVar22 >> 3) * 0x6db6db6db6db6db7;
      uVar18 = uVar33 >> 1;
      pFVar28 = begin + uVar18;
      if (uVar22 < 0x1c01) {
        dVar2 = begin->score;
        uVar34 = SUB84(dVar2,0);
        uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        if (pFVar28->score <= dVar2 && dVar2 != pFVar28->score) {
          local_108 = pFVar28->fractionality;
          dVar2 = pFVar28->row_ep_norm2;
          uStack_f4 = *(undefined8 *)((long)&pFVar28->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_100 = SUB84(dVar2,0);
          uStack_fc = (undefined4)((ulong)dVar2 >> 0x20);
          ppVar26 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = (pFVar28->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar8 = begin->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin->row_ep_norm2 + 4);
          uVar13 = *(undefined8 *)((long)&begin->score + 4);
          pFVar28->fractionality = begin->fractionality;
          pFVar28->row_ep_norm2 = dVar8;
          *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) = uVar9;
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar13;
          ppVar11 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (begin->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (begin->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&begin->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin->score + 4) = uStack_f4;
          begin->fractionality = local_108;
          begin->row_ep_norm2 = dVar2;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(begin->score,0);
          uVar35 = (undefined4)((ulong)begin->score >> 0x20);
        }
        if ((double)CONCAT44(uVar35,uVar34) <= end._M_current[-1].score &&
            end._M_current[-1].score != (double)CONCAT44(uVar35,uVar34)) {
          dVar2 = begin->fractionality;
          uStack_f4 = *(undefined8 *)((long)&begin->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin->row_ep_norm2 + 4) >> 0x20);
          uStack_100 = SUB84(begin->row_ep_norm2,0);
          uStack_fc = (undefined4)((ulong)begin->row_ep_norm2 >> 0x20);
          ppVar26 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = (begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar8 = pFVar20->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&pFVar20->row_ep_norm2 + 4);
          uVar13 = *(undefined8 *)((long)&pFVar20->score + 4);
          begin->fractionality = pFVar20->fractionality;
          begin->row_ep_norm2 = dVar8;
          *(undefined8 *)((long)&begin->row_ep_norm2 + 4) = uVar9;
          *(undefined8 *)((long)&begin->score + 4) = uVar13;
          ppVar11 = end._M_current[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               end._M_current[-1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               end._M_current[-1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&pFVar20->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&pFVar20->score + 4) = uStack_f4;
          local_108._0_4_ = SUB84(dVar2,0);
          local_108._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
          *(undefined4 *)&pFVar20->fractionality = (undefined4)local_108;
          *(undefined4 *)((long)&pFVar20->fractionality + 4) = local_108._4_4_;
          *(undefined4 *)&pFVar20->row_ep_norm2 = uStack_100;
          *(undefined4 *)((long)&pFVar20->row_ep_norm2 + 4) = uStack_fc;
          end._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          end._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          end._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(begin->score,0);
          uVar35 = (undefined4)((ulong)begin->score >> 0x20);
          local_108 = dVar2;
        }
        if (pFVar28->score <= (double)CONCAT44(uVar35,uVar34) &&
            (double)CONCAT44(uVar35,uVar34) != pFVar28->score) {
          dVar2 = pFVar28->fractionality;
          uStack_f4 = *(undefined8 *)((long)&pFVar28->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_100 = SUB84(pFVar28->row_ep_norm2,0);
          uStack_fc = (undefined4)((ulong)pFVar28->row_ep_norm2 >> 0x20);
          ppVar26 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar34 = *(undefined4 *)
                    &(pFVar28->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar35 = *(undefined4 *)
                    ((long)&(pFVar28->row_ep).
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4);
          uVar6 = *(undefined4 *)
                   &(pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar7 = *(undefined4 *)
                   ((long)&(pFVar28->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 4);
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar8 = begin->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin->row_ep_norm2 + 4);
          uVar13 = *(undefined8 *)((long)&begin->score + 4);
          pFVar28->fractionality = begin->fractionality;
          pFVar28->row_ep_norm2 = dVar8;
          *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) = uVar9;
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar13;
          ppVar4 = (begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (begin->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar4;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (begin->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&begin->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin->score + 4) = uStack_f4;
          local_108._0_4_ = SUB84(dVar2,0);
          local_108._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
          *(undefined4 *)&begin->fractionality = (undefined4)local_108;
          *(undefined4 *)((long)&begin->fractionality + 4) = local_108._4_4_;
          *(undefined4 *)&begin->row_ep_norm2 = uStack_100;
          *(undefined4 *)((long)&begin->row_ep_norm2 + 4) = uStack_fc;
          *(undefined4 *)
           &(begin->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = uVar34;
          *(undefined4 *)
           ((long)&(begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) = uVar35;
          *(undefined4 *)
           &(begin->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = uVar6;
          *(undefined4 *)
           ((long)&(begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar7;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          local_108 = dVar2;
        }
      }
      else {
        dVar2 = pFVar28->score;
        uVar34 = SUB84(dVar2,0);
        uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        if (begin->score <= dVar2 && dVar2 != begin->score) {
          dVar2 = begin->fractionality;
          dVar8 = begin->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin->row_ep_norm2 + 4) >> 0x20);
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = (begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar28->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&pFVar28->score + 4);
          begin->fractionality = pFVar28->fractionality;
          begin->row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&begin->row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&begin->score + 4) = uVar14;
          ppVar11 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pFVar28->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pFVar28->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&pFVar28->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar9;
          pFVar28->fractionality = dVar2;
          pFVar28->row_ep_norm2 = dVar8;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(pFVar28->score,0);
          uVar35 = (undefined4)((ulong)pFVar28->score >> 0x20);
        }
        if ((double)CONCAT44(uVar35,uVar34) <= end._M_current[-1].score &&
            end._M_current[-1].score != (double)CONCAT44(uVar35,uVar34)) {
          dVar2 = pFVar28->fractionality;
          dVar8 = pFVar28->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&pFVar28->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = (pFVar28->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar20->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&pFVar20->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&pFVar20->score + 4);
          pFVar28->fractionality = pFVar20->fractionality;
          pFVar28->row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar14;
          ppVar11 = end._M_current[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               end._M_current[-1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               end._M_current[-1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&pFVar20->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&pFVar20->score + 4) = uVar9;
          pFVar20->fractionality = dVar2;
          pFVar20->row_ep_norm2 = dVar8;
          end._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          end._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          end._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(pFVar28->score,0);
          uVar35 = (undefined4)((ulong)pFVar28->score >> 0x20);
        }
        if (begin->score <= (double)CONCAT44(uVar35,uVar34) &&
            (double)CONCAT44(uVar35,uVar34) != begin->score) {
          dVar2 = begin->fractionality;
          dVar8 = begin->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin->row_ep_norm2 + 4) >> 0x20);
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = (begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (begin->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar28->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&pFVar28->score + 4);
          begin->fractionality = pFVar28->fractionality;
          begin->row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&begin->row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&begin->score + 4) = uVar14;
          ppVar11 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pFVar28->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          (begin->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pFVar28->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&pFVar28->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar9;
          pFVar28->fractionality = dVar2;
          pFVar28->row_ep_norm2 = dVar8;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
        }
        pFVar24 = begin + 1;
        pFVar23 = begin + (uVar18 - 1);
        dVar2 = begin[uVar18 - 1].score;
        uVar34 = SUB84(dVar2,0);
        uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        if (begin[1].score <= dVar2 && dVar2 != begin[1].score) {
          dVar2 = pFVar24->fractionality;
          dVar8 = begin[1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[1].score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin[1].row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = begin[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar23->fractionality;
          dVar15 = begin[uVar18 - 1].row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&begin[uVar18 - 1].score + 4);
          *(undefined8 *)((long)&begin[1].row_ep_norm2 + 4) =
               *(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4);
          *(undefined8 *)((long)&begin[1].score + 4) = uVar13;
          pFVar24->fractionality = dVar12;
          begin[1].row_ep_norm2 = dVar15;
          ppVar11 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               begin[uVar18 - 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               begin[uVar18 - 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin[uVar18 - 1].score + 4) = uVar9;
          pFVar23->fractionality = dVar2;
          begin[uVar18 - 1].row_ep_norm2 = dVar8;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(begin[uVar18 - 1].score,0);
          uVar35 = (undefined4)((ulong)begin[uVar18 - 1].score >> 0x20);
        }
        if ((double)CONCAT44(uVar35,uVar34) <= end._M_current[-2].score &&
            end._M_current[-2].score != (double)CONCAT44(uVar35,uVar34)) {
          dVar2 = pFVar23->fractionality;
          dVar8 = begin[uVar18 - 1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[uVar18 - 1].score + 4);
          uStack_f8 = (undefined4)
                      ((ulong)*(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) >> 0x20);
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = begin[uVar18 - 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = local_88->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&local_88->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&local_88->score + 4);
          pFVar23->fractionality = local_88->fractionality;
          begin[uVar18 - 1].row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&begin[uVar18 - 1].score + 4) = uVar14;
          ppVar11 = end._M_current[-2].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               end._M_current[-2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               end._M_current[-2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&local_88->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&local_88->score + 4) = uVar9;
          local_88->fractionality = dVar2;
          local_88->row_ep_norm2 = dVar8;
          end._M_current[-2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          end._M_current[-2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          end._M_current[-2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(begin[uVar18 - 1].score,0);
          uVar35 = (undefined4)((ulong)begin[uVar18 - 1].score >> 0x20);
        }
        if (begin[1].score <= (double)CONCAT44(uVar35,uVar34) &&
            (double)CONCAT44(uVar35,uVar34) != begin[1].score) {
          dVar2 = pFVar24->fractionality;
          dVar8 = begin[1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[1].score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin[1].row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = begin[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar23->fractionality;
          dVar15 = begin[uVar18 - 1].row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&begin[uVar18 - 1].score + 4);
          *(undefined8 *)((long)&begin[1].row_ep_norm2 + 4) =
               *(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4);
          *(undefined8 *)((long)&begin[1].score + 4) = uVar13;
          pFVar24->fractionality = dVar12;
          begin[1].row_ep_norm2 = dVar15;
          ppVar11 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               begin[uVar18 - 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          begin[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               begin[uVar18 - 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin[uVar18 - 1].score + 4) = uVar9;
          pFVar23->fractionality = dVar2;
          begin[uVar18 - 1].row_ep_norm2 = dVar8;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
        }
        pFVar24 = begin + 2;
        pFVar25 = begin + uVar18 + 1;
        dVar2 = begin[uVar18 + 1].score;
        uVar34 = SUB84(dVar2,0);
        uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        if (begin[2].score <= dVar2 && dVar2 != begin[2].score) {
          dVar2 = pFVar24->fractionality;
          dVar8 = begin[2].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[2].score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin[2].row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[2].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = begin[2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[2].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar25->fractionality;
          dVar15 = begin[uVar18 + 1].row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&begin[uVar18 + 1].score + 4);
          *(undefined8 *)((long)&begin[2].row_ep_norm2 + 4) =
               *(undefined8 *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4);
          *(undefined8 *)((long)&begin[2].score + 4) = uVar13;
          pFVar24->fractionality = dVar12;
          begin[2].row_ep_norm2 = dVar15;
          ppVar11 = begin[uVar18 + 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               begin[uVar18 + 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               begin[uVar18 + 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin[uVar18 + 1].score + 4) = uVar9;
          pFVar25->fractionality = dVar2;
          begin[uVar18 + 1].row_ep_norm2 = dVar8;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(begin[uVar18 + 1].score,0);
          uVar35 = (undefined4)((ulong)begin[uVar18 + 1].score >> 0x20);
        }
        if ((double)CONCAT44(uVar35,uVar34) <= end._M_current[-3].score &&
            end._M_current[-3].score != (double)CONCAT44(uVar35,uVar34)) {
          dVar2 = pFVar25->fractionality;
          dVar8 = begin[uVar18 + 1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[uVar18 + 1].score + 4);
          uStack_f8 = (undefined4)
                      ((ulong)*(undefined8 *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4) >> 0x20);
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[uVar18 + 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = begin[uVar18 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[uVar18 + 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = local_90->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&local_90->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&local_90->score + 4);
          pFVar25->fractionality = local_90->fractionality;
          begin[uVar18 + 1].row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&begin[uVar18 + 1].score + 4) = uVar14;
          ppVar11 = end._M_current[-3].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               end._M_current[-3].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               end._M_current[-3].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&local_90->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&local_90->score + 4) = uVar9;
          local_90->fractionality = dVar2;
          local_90->row_ep_norm2 = dVar8;
          end._M_current[-3].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          end._M_current[-3].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          end._M_current[-3].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(begin[uVar18 + 1].score,0);
          uVar35 = (undefined4)((ulong)begin[uVar18 + 1].score >> 0x20);
        }
        if (begin[2].score <= (double)CONCAT44(uVar35,uVar34) &&
            (double)CONCAT44(uVar35,uVar34) != begin[2].score) {
          dVar2 = pFVar24->fractionality;
          dVar8 = begin[2].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[2].score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin[2].row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[2].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar4 = begin[2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[2].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dVar12 = pFVar25->fractionality;
          dVar15 = begin[uVar18 + 1].row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&begin[uVar18 + 1].score + 4);
          *(undefined8 *)((long)&begin[2].row_ep_norm2 + 4) =
               *(undefined8 *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4);
          *(undefined8 *)((long)&begin[2].score + 4) = uVar13;
          pFVar24->fractionality = dVar12;
          begin[2].row_ep_norm2 = dVar15;
          ppVar11 = begin[uVar18 + 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               begin[uVar18 + 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          begin[2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               begin[uVar18 + 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(ulong *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin[uVar18 + 1].score + 4) = uVar9;
          pFVar25->fractionality = dVar2;
          begin[uVar18 + 1].row_ep_norm2 = dVar8;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
        }
        dVar2 = pFVar28->score;
        uVar34 = SUB84(dVar2,0);
        uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        if (begin[uVar18 - 1].score <= dVar2 && dVar2 != begin[uVar18 - 1].score) {
          dVar2 = pFVar23->fractionality;
          dVar8 = begin[uVar18 - 1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[uVar18 - 1].score + 4);
          uStack_f8 = (undefined4)
                      ((ulong)*(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) >> 0x20);
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          dVar12 = pFVar28->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&pFVar28->score + 4);
          pFVar23->fractionality = pFVar28->fractionality;
          begin[uVar18 - 1].row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&begin[uVar18 - 1].score + 4) = uVar14;
          ppVar4 = (pFVar28->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pFVar28->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar11 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar16 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          *(ulong *)((long)&pFVar28->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar9;
          pFVar28->fractionality = dVar2;
          pFVar28->row_ep_norm2 = dVar8;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar11;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar16;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(pFVar28->score,0);
          uVar35 = (undefined4)((ulong)pFVar28->score >> 0x20);
        }
        if ((double)CONCAT44(uVar35,uVar34) <= begin[uVar18 + 1].score &&
            begin[uVar18 + 1].score != (double)CONCAT44(uVar35,uVar34)) {
          dVar2 = pFVar28->fractionality;
          dVar8 = pFVar28->row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&pFVar28->score + 4);
          uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) >> 0x20)
          ;
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          dVar12 = begin[uVar18 + 1].row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&begin[uVar18 + 1].score + 4);
          pFVar28->fractionality = pFVar25->fractionality;
          pFVar28->row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar14;
          ppVar4 = begin[uVar18 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = begin[uVar18 + 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               begin[uVar18 + 1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar11 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar16 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          *(ulong *)((long)&begin[uVar18 + 1].row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&begin[uVar18 + 1].score + 4) = uVar9;
          pFVar25->fractionality = dVar2;
          begin[uVar18 + 1].row_ep_norm2 = dVar8;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar11;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar16;
          begin[uVar18 + 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
          uVar34 = SUB84(pFVar28->score,0);
          uVar35 = (undefined4)((ulong)pFVar28->score >> 0x20);
        }
        if (begin[uVar18 - 1].score <= (double)CONCAT44(uVar35,uVar34) &&
            (double)CONCAT44(uVar35,uVar34) != begin[uVar18 - 1].score) {
          dVar2 = pFVar23->fractionality;
          dVar8 = begin[uVar18 - 1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&begin[uVar18 - 1].score + 4);
          uStack_f8 = (undefined4)
                      ((ulong)*(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) >> 0x20);
          uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
          ppVar26 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          dVar12 = pFVar28->row_ep_norm2;
          uVar13 = *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4);
          uVar14 = *(undefined8 *)((long)&pFVar28->score + 4);
          pFVar23->fractionality = pFVar28->fractionality;
          begin[uVar18 - 1].row_ep_norm2 = dVar12;
          *(undefined8 *)((long)&begin[uVar18 - 1].row_ep_norm2 + 4) = uVar13;
          *(undefined8 *)((long)&begin[uVar18 - 1].score + 4) = uVar14;
          ppVar4 = (pFVar28->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (pFVar28->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pFVar28->row_ep).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppVar11 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar16 = begin[uVar18 - 1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar4;
          begin[uVar18 - 1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar10;
          *(ulong *)((long)&pFVar28->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
          *(undefined8 *)((long)&pFVar28->score + 4) = uVar9;
          pFVar28->fractionality = dVar2;
          pFVar28->row_ep_norm2 = dVar8;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar11;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar16;
          (pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
        }
        dVar2 = begin->fractionality;
        uStack_f4 = *(undefined8 *)((long)&begin->score + 4);
        uStack_f8 = (undefined4)((ulong)*(undefined8 *)((long)&begin->row_ep_norm2 + 4) >> 0x20);
        uStack_100 = SUB84(begin->row_ep_norm2,0);
        uStack_fc = (undefined4)((ulong)begin->row_ep_norm2 >> 0x20);
        ppVar26 = (begin->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar34 = *(undefined4 *)
                  &(begin->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar35 = *(undefined4 *)
                  ((long)&(begin->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
        uVar6 = *(undefined4 *)
                 &(begin->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar7 = *(undefined4 *)
                 ((long)&(begin->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
        (begin->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (begin->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (begin->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar8 = pFVar28->row_ep_norm2;
        uVar9 = *(undefined8 *)((long)&pFVar28->row_ep_norm2 + 4);
        uVar13 = *(undefined8 *)((long)&pFVar28->score + 4);
        begin->fractionality = pFVar28->fractionality;
        begin->row_ep_norm2 = dVar8;
        *(undefined8 *)((long)&begin->row_ep_norm2 + 4) = uVar9;
        *(undefined8 *)((long)&begin->score + 4) = uVar13;
        ppVar4 = (pFVar28->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (begin->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pFVar28->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (begin->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar4;
        (begin->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pFVar28->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(ulong *)((long)&pFVar28->row_ep_norm2 + 4) = CONCAT44(uStack_f8,uStack_fc);
        *(undefined8 *)((long)&pFVar28->score + 4) = uStack_f4;
        local_108._0_4_ = SUB84(dVar2,0);
        local_108._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
        *(undefined4 *)&pFVar28->fractionality = (undefined4)local_108;
        *(undefined4 *)((long)&pFVar28->fractionality + 4) = local_108._4_4_;
        *(undefined4 *)&pFVar28->row_ep_norm2 = uStack_100;
        *(undefined4 *)((long)&pFVar28->row_ep_norm2 + 4) = uStack_fc;
        *(undefined4 *)
         &(pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = uVar34;
        *(undefined4 *)
         ((long)&(pFVar28->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = uVar35;
        *(undefined4 *)
         &(pFVar28->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = uVar6;
        *(undefined4 *)
         ((long)&(pFVar28->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar7;
        (pFVar28->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar26;
        local_108 = dVar2;
      }
      local_e8._M_current = begin;
      if (((param_4 & 1) != 0) ||
         (begin->score <= begin[-1].score && begin[-1].score != begin->score)) {
        pVar36 = partition_right_branchless<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                           (begin,end._M_current);
        _Var21._M_current = local_e8._M_current;
        _Var19 = pVar36.first._M_current;
        uVar18 = ((long)_Var19._M_current - (long)begin >> 3) * 0x6db6db6db6db6db7;
        pFVar28 = _Var19._M_current + 1;
        local_80 = (long)end._M_current - (long)pFVar28;
        uVar22 = ((long)local_80 >> 3) * 0x6db6db6db6db6db7;
        uVar33 = uVar33 >> 3;
        local_c0 = _Var19._M_current;
        if (((long)uVar18 < (long)uVar33) || ((long)uVar22 < (long)uVar33)) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<FractionalInteger>>>
                      (local_e8,end,(_Iter_comp_iter<std::less<FractionalInteger>_> *)&local_108);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<FractionalInteger>>>
                      (_Var21,end,(_Iter_comp_iter<std::less<FractionalInteger>_> *)&local_108);
            return;
          }
          if (0x508 < (long)_Var19._M_current - (long)begin) {
            uVar33 = uVar18 >> 2;
            dVar2 = (local_e8._M_current)->fractionality;
            dVar8 = (local_e8._M_current)->row_ep_norm2;
            uVar9 = *(undefined8 *)((long)&(local_e8._M_current)->score + 4);
            uStack_f8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&(local_e8._M_current)->row_ep_norm2 + 4) >>
                        0x20);
            uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
            ppVar26 = ((local_e8._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar4 = ((local_e8._M_current)->row_ep).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar10 = ((local_e8._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((local_e8._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((local_e8._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((local_e8._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar12 = local_e8._M_current[uVar33].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&local_e8._M_current[uVar33].row_ep_norm2 + 4);
            uVar13 = *puVar1;
            uVar14 = puVar1[1];
            (local_e8._M_current)->fractionality = local_e8._M_current[uVar33].fractionality;
            (local_e8._M_current)->row_ep_norm2 = dVar12;
            *(undefined8 *)((long)&(local_e8._M_current)->row_ep_norm2 + 4) = uVar13;
            *(undefined8 *)((long)&(local_e8._M_current)->score + 4) = uVar14;
            ppVar11 = local_e8._M_current[uVar33].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((local_e8._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 local_e8._M_current[uVar33].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((local_e8._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar11;
            ((local_e8._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_e8._M_current[uVar33].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&local_e8._M_current[uVar33].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(uStack_f8,uStack_fc);
            puVar1[1] = uVar9;
            local_e8._M_current[uVar33].fractionality = dVar2;
            local_e8._M_current[uVar33].row_ep_norm2 = dVar8;
            local_e8._M_current[uVar33].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar4;
            local_e8._M_current[uVar33].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar10;
            local_e8._M_current[uVar33].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
            local_108 = _Var19._M_current[-1].fractionality;
            dVar2 = _Var19._M_current[-1].row_ep_norm2;
            uStack_f4 = *(undefined8 *)((long)&_Var19._M_current[-1].score + 4);
            uStack_f8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&_Var19._M_current[-1].row_ep_norm2 + 4) >>
                        0x20);
            uStack_100 = SUB84(dVar2,0);
            uStack_fc = (undefined4)((ulong)dVar2 >> 0x20);
            ppVar26 = _Var19._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar4 = _Var19._M_current[-1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar10 = _Var19._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            _Var19._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            _Var19._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var19._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar8 = _Var19._M_current[-uVar33].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&_Var19._M_current[-uVar33].row_ep_norm2 + 4);
            uVar9 = *puVar1;
            uVar13 = puVar1[1];
            _Var19._M_current[-1].fractionality = _Var19._M_current[-uVar33].fractionality;
            _Var19._M_current[-1].row_ep_norm2 = dVar8;
            *(undefined8 *)((long)&_Var19._M_current[-1].row_ep_norm2 + 4) = uVar9;
            *(undefined8 *)((long)&_Var19._M_current[-1].score + 4) = uVar13;
            ppVar11 = _Var19._M_current[-uVar33].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            _Var19._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 _Var19._M_current[-uVar33].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var19._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar11;
            _Var19._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 _Var19._M_current[-uVar33].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&_Var19._M_current[-uVar33].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(uStack_f8,uStack_fc);
            puVar1[1] = uStack_f4;
            _Var19._M_current[-uVar33].fractionality = local_108;
            _Var19._M_current[-uVar33].row_ep_norm2 = dVar2;
            _Var19._M_current[-uVar33].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar4;
            _Var19._M_current[-uVar33].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar10;
            _Var19._M_current[-uVar33].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
            if (0x80 < uVar18) {
              dVar2 = local_e8._M_current[1].fractionality;
              dVar8 = local_e8._M_current[1].row_ep_norm2;
              uVar9 = *(undefined8 *)((long)&local_e8._M_current[1].score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&local_e8._M_current[1].row_ep_norm2 + 4) >>
                          0x20);
              uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
              ppVar26 = local_e8._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = local_e8._M_current[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = local_e8._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_e8._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_e8._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar12 = local_e8._M_current[uVar33 + 1].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&local_e8._M_current[uVar33 + 1].row_ep_norm2 + 4);
              uVar13 = *puVar1;
              uVar14 = puVar1[1];
              local_e8._M_current[1].fractionality = local_e8._M_current[uVar33 + 1].fractionality;
              local_e8._M_current[1].row_ep_norm2 = dVar12;
              *(undefined8 *)((long)&local_e8._M_current[1].row_ep_norm2 + 4) = uVar13;
              *(undefined8 *)((long)&local_e8._M_current[1].score + 4) = uVar14;
              ppVar11 = local_e8._M_current[uVar33 + 1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_e8._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   local_e8._M_current[uVar33 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_e8._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              local_e8._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_e8._M_current[uVar33 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&local_e8._M_current[uVar33 + 1].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(uStack_f8,uStack_fc);
              puVar1[1] = uVar9;
              local_e8._M_current[uVar33 + 1].fractionality = dVar2;
              local_e8._M_current[uVar33 + 1].row_ep_norm2 = dVar8;
              local_e8._M_current[uVar33 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              local_e8._M_current[uVar33 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              local_e8._M_current[uVar33 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
              dVar2 = local_e8._M_current[2].fractionality;
              dVar8 = local_e8._M_current[2].row_ep_norm2;
              uVar9 = *(undefined8 *)((long)&local_e8._M_current[2].score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&local_e8._M_current[2].row_ep_norm2 + 4) >>
                          0x20);
              uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
              ppVar26 = local_e8._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = local_e8._M_current[2].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = local_e8._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_e8._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_e8._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar12 = local_e8._M_current[uVar33 + 2].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&local_e8._M_current[uVar33 + 2].row_ep_norm2 + 4);
              uVar13 = *puVar1;
              uVar14 = puVar1[1];
              local_e8._M_current[2].fractionality = local_e8._M_current[uVar33 + 2].fractionality;
              local_e8._M_current[2].row_ep_norm2 = dVar12;
              *(undefined8 *)((long)&local_e8._M_current[2].row_ep_norm2 + 4) = uVar13;
              *(undefined8 *)((long)&local_e8._M_current[2].score + 4) = uVar14;
              ppVar11 = local_e8._M_current[uVar33 + 2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_e8._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   local_e8._M_current[uVar33 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_e8._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              local_e8._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_e8._M_current[uVar33 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&local_e8._M_current[uVar33 + 2].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(uStack_f8,uStack_fc);
              puVar1[1] = uVar9;
              local_e8._M_current[uVar33 + 2].fractionality = dVar2;
              local_e8._M_current[uVar33 + 2].row_ep_norm2 = dVar8;
              local_e8._M_current[uVar33 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              local_e8._M_current[uVar33 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              local_e8._M_current[uVar33 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
              uVar18 = ~uVar33;
              dVar2 = _Var19._M_current[-2].fractionality;
              dVar8 = _Var19._M_current[-2].row_ep_norm2;
              uVar9 = *(undefined8 *)((long)&_Var19._M_current[-2].score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var19._M_current[-2].row_ep_norm2 + 4) >>
                          0x20);
              uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
              ppVar26 = _Var19._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = _Var19._M_current[-2].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = _Var19._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _Var19._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var19._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar12 = _Var19._M_current[uVar18].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&_Var19._M_current[uVar18].row_ep_norm2 + 4);
              uVar13 = *puVar1;
              uVar14 = puVar1[1];
              _Var19._M_current[-2].fractionality = _Var19._M_current[uVar18].fractionality;
              _Var19._M_current[-2].row_ep_norm2 = dVar12;
              *(undefined8 *)((long)&_Var19._M_current[-2].row_ep_norm2 + 4) = uVar13;
              *(undefined8 *)((long)&_Var19._M_current[-2].score + 4) = uVar14;
              ppVar11 = _Var19._M_current[uVar18].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   _Var19._M_current[uVar18].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              _Var19._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              _Var19._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   _Var19._M_current[uVar18].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&_Var19._M_current[uVar18].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(uStack_f8,uStack_fc);
              puVar1[1] = uVar9;
              _Var19._M_current[uVar18].fractionality = dVar2;
              _Var19._M_current[uVar18].row_ep_norm2 = dVar8;
              _Var19._M_current[uVar18].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              _Var19._M_current[uVar18].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              _Var19._M_current[uVar18].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
              lVar27 = -2 - uVar33;
              local_108 = _Var19._M_current[-3].fractionality;
              dVar2 = _Var19._M_current[-3].row_ep_norm2;
              uStack_f4 = *(undefined8 *)((long)&_Var19._M_current[-3].score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var19._M_current[-3].row_ep_norm2 + 4) >>
                          0x20);
              uStack_100 = SUB84(dVar2,0);
              uStack_fc = (undefined4)((ulong)dVar2 >> 0x20);
              ppVar26 = _Var19._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = _Var19._M_current[-3].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = _Var19._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _Var19._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var19._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = _Var19._M_current[lVar27].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&_Var19._M_current[lVar27].row_ep_norm2 + 4);
              uVar9 = *puVar1;
              uVar13 = puVar1[1];
              _Var19._M_current[-3].fractionality = _Var19._M_current[lVar27].fractionality;
              _Var19._M_current[-3].row_ep_norm2 = dVar8;
              *(undefined8 *)((long)&_Var19._M_current[-3].row_ep_norm2 + 4) = uVar9;
              *(undefined8 *)((long)&_Var19._M_current[-3].score + 4) = uVar13;
              ppVar11 = _Var19._M_current[lVar27].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   _Var19._M_current[lVar27].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              _Var19._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              _Var19._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   _Var19._M_current[lVar27].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&_Var19._M_current[lVar27].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(uStack_f8,uStack_fc);
              puVar1[1] = uStack_f4;
              _Var19._M_current[lVar27].fractionality = local_108;
              _Var19._M_current[lVar27].row_ep_norm2 = dVar2;
              _Var19._M_current[lVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              _Var19._M_current[lVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              _Var19._M_current[lVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
            }
          }
          begin = pFVar28;
          if (0x508 < (long)local_80) {
            uVar18 = uVar22 >> 2;
            dVar2 = pFVar28->fractionality;
            dVar8 = _Var19._M_current[1].row_ep_norm2;
            uVar9 = *(undefined8 *)((long)&_Var19._M_current[1].score + 4);
            uStack_f8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&_Var19._M_current[1].row_ep_norm2 + 4) >>
                        0x20);
            uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
            ppVar26 = _Var19._M_current[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar4 = _Var19._M_current[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar10 = _Var19._M_current[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            _Var19._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            _Var19._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _Var19._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar12 = _Var19._M_current[uVar18 + 1].fractionality;
            dVar15 = _Var19._M_current[uVar18 + 1].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&_Var19._M_current[uVar18 + 1].row_ep_norm2 + 4);
            uVar13 = puVar1[1];
            *(undefined8 *)((long)&_Var19._M_current[1].row_ep_norm2 + 4) = *puVar1;
            *(undefined8 *)((long)&_Var19._M_current[1].score + 4) = uVar13;
            pFVar28->fractionality = dVar12;
            _Var19._M_current[1].row_ep_norm2 = dVar15;
            ppVar11 = _Var19._M_current[uVar18 + 1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            _Var19._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 _Var19._M_current[uVar18 + 1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Var19._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar11;
            _Var19._M_current[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 _Var19._M_current[uVar18 + 1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&_Var19._M_current[uVar18 + 1].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(uStack_f8,uStack_fc);
            puVar1[1] = uVar9;
            _Var19._M_current[uVar18 + 1].fractionality = dVar2;
            _Var19._M_current[uVar18 + 1].row_ep_norm2 = dVar8;
            _Var19._M_current[uVar18 + 1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar4;
            _Var19._M_current[uVar18 + 1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar10;
            _Var19._M_current[uVar18 + 1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
            local_108 = pFVar20->fractionality;
            dVar2 = pFVar20->row_ep_norm2;
            uStack_f4 = *(undefined8 *)((long)&pFVar20->score + 4);
            uStack_f8 = (undefined4)
                        ((ulong)*(undefined8 *)((long)&pFVar20->row_ep_norm2 + 4) >> 0x20);
            uStack_100 = SUB84(dVar2,0);
            uStack_fc = (undefined4)((ulong)dVar2 >> 0x20);
            ppVar26 = end._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar4 = end._M_current[-1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar10 = end._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (local_40->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (local_40->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_40->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar8 = end._M_current[-uVar18].fractionality;
            dVar12 = end._M_current[-uVar18].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&end._M_current[-uVar18].row_ep_norm2 + 4);
            uVar9 = puVar1[1];
            *(undefined8 *)((long)&pFVar20->row_ep_norm2 + 4) = *puVar1;
            *(undefined8 *)((long)&pFVar20->score + 4) = uVar9;
            pFVar20->fractionality = dVar8;
            pFVar20->row_ep_norm2 = dVar12;
            ppVar11 = end._M_current[-uVar18].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            end._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 end._M_current[-uVar18].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            end._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar11;
            end._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 end._M_current[-uVar18].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&end._M_current[-uVar18].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(uStack_f8,uStack_fc);
            puVar1[1] = uStack_f4;
            end._M_current[-uVar18].fractionality = local_108;
            end._M_current[-uVar18].row_ep_norm2 = dVar2;
            end._M_current[-uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar4;
            end._M_current[-uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar10;
            end._M_current[-uVar18].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
            if (0x80 < uVar22) {
              dVar2 = _Var19._M_current[2].fractionality;
              dVar8 = _Var19._M_current[2].row_ep_norm2;
              uVar9 = *(undefined8 *)((long)&_Var19._M_current[2].score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var19._M_current[2].row_ep_norm2 + 4) >>
                          0x20);
              uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
              ppVar26 = _Var19._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = _Var19._M_current[2].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = _Var19._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _Var19._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var19._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar12 = _Var19._M_current[uVar18 + 2].row_ep_norm2;
              uVar13 = *(undefined8 *)((long)&_Var19._M_current[uVar18 + 2].row_ep_norm2 + 4);
              uVar14 = *(undefined8 *)((long)&_Var19._M_current[uVar18 + 2].score + 4);
              _Var19._M_current[2].fractionality = _Var19._M_current[uVar18 + 2].fractionality;
              _Var19._M_current[2].row_ep_norm2 = dVar12;
              *(undefined8 *)((long)&_Var19._M_current[2].row_ep_norm2 + 4) = uVar13;
              *(undefined8 *)((long)&_Var19._M_current[2].score + 4) = uVar14;
              ppVar11 = _Var19._M_current[uVar18 + 2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   _Var19._M_current[uVar18 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              _Var19._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              _Var19._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   _Var19._M_current[uVar18 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(ulong *)((long)&_Var19._M_current[uVar18 + 2].row_ep_norm2 + 4) =
                   CONCAT44(uStack_f8,uStack_fc);
              *(undefined8 *)((long)&_Var19._M_current[uVar18 + 2].score + 4) = uVar9;
              _Var19._M_current[uVar18 + 2].fractionality = dVar2;
              _Var19._M_current[uVar18 + 2].row_ep_norm2 = dVar8;
              _Var19._M_current[uVar18 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              _Var19._M_current[uVar18 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              _Var19._M_current[uVar18 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
              dVar2 = _Var19._M_current[3].fractionality;
              dVar8 = _Var19._M_current[3].row_ep_norm2;
              uVar9 = *(undefined8 *)((long)&_Var19._M_current[3].score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&_Var19._M_current[3].row_ep_norm2 + 4) >>
                          0x20);
              uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
              ppVar26 = _Var19._M_current[3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = _Var19._M_current[3].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = _Var19._M_current[3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _Var19._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _Var19._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar12 = _Var19._M_current[uVar18 + 3].row_ep_norm2;
              uVar13 = *(undefined8 *)((long)&_Var19._M_current[uVar18 + 3].row_ep_norm2 + 4);
              uVar14 = *(undefined8 *)((long)&_Var19._M_current[uVar18 + 3].score + 4);
              _Var19._M_current[3].fractionality = _Var19._M_current[uVar18 + 3].fractionality;
              _Var19._M_current[3].row_ep_norm2 = dVar12;
              *(undefined8 *)((long)&_Var19._M_current[3].row_ep_norm2 + 4) = uVar13;
              *(undefined8 *)((long)&_Var19._M_current[3].score + 4) = uVar14;
              ppVar11 = _Var19._M_current[uVar18 + 3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              _Var19._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   _Var19._M_current[uVar18 + 3].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              _Var19._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              _Var19._M_current[3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   _Var19._M_current[uVar18 + 3].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(ulong *)((long)&_Var19._M_current[uVar18 + 3].row_ep_norm2 + 4) =
                   CONCAT44(uStack_f8,uStack_fc);
              *(undefined8 *)((long)&_Var19._M_current[uVar18 + 3].score + 4) = uVar9;
              _Var19._M_current[uVar18 + 3].fractionality = dVar2;
              _Var19._M_current[uVar18 + 3].row_ep_norm2 = dVar8;
              _Var19._M_current[uVar18 + 3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              _Var19._M_current[uVar18 + 3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              _Var19._M_current[uVar18 + 3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
              uVar22 = ~uVar18;
              dVar2 = local_88->fractionality;
              dVar8 = local_88->row_ep_norm2;
              uVar9 = *(undefined8 *)((long)&local_88->score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&local_88->row_ep_norm2 + 4) >> 0x20);
              uStack_fc = (undefined4)((ulong)dVar8 >> 0x20);
              ppVar26 = end._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = end._M_current[-2].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = end._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              (local_48->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_48->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_48->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar12 = end._M_current[uVar22].fractionality;
              dVar15 = end._M_current[uVar22].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&end._M_current[uVar22].row_ep_norm2 + 4);
              uVar13 = puVar1[1];
              *(undefined8 *)((long)&local_88->row_ep_norm2 + 4) = *puVar1;
              *(undefined8 *)((long)&local_88->score + 4) = uVar13;
              local_88->fractionality = dVar12;
              local_88->row_ep_norm2 = dVar15;
              ppVar11 = end._M_current[uVar22].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              end._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   end._M_current[uVar22].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              end._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              end._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   end._M_current[uVar22].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&end._M_current[uVar22].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(uStack_f8,uStack_fc);
              puVar1[1] = uVar9;
              end._M_current[uVar22].fractionality = dVar2;
              end._M_current[uVar22].row_ep_norm2 = dVar8;
              end._M_current[uVar22].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              end._M_current[uVar22].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              end._M_current[uVar22].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
              lVar27 = -2 - uVar18;
              local_108 = local_90->fractionality;
              dVar2 = local_90->row_ep_norm2;
              uStack_f4 = *(undefined8 *)((long)&local_90->score + 4);
              uStack_f8 = (undefined4)
                          ((ulong)*(undefined8 *)((long)&local_90->row_ep_norm2 + 4) >> 0x20);
              uStack_100 = SUB84(dVar2,0);
              uStack_fc = (undefined4)((ulong)dVar2 >> 0x20);
              ppVar26 = end._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar4 = end._M_current[-3].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar10 = end._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              (local_50->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_50->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_50->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar8 = end._M_current[lVar27].fractionality;
              dVar12 = end._M_current[lVar27].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&end._M_current[lVar27].row_ep_norm2 + 4);
              uVar9 = puVar1[1];
              *(undefined8 *)((long)&local_90->row_ep_norm2 + 4) = *puVar1;
              *(undefined8 *)((long)&local_90->score + 4) = uVar9;
              local_90->fractionality = dVar8;
              local_90->row_ep_norm2 = dVar12;
              ppVar11 = end._M_current[lVar27].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              end._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   end._M_current[lVar27].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              end._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar11;
              end._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   end._M_current[lVar27].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&end._M_current[lVar27].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(uStack_f8,uStack_fc);
              puVar1[1] = uStack_f4;
              end._M_current[lVar27].fractionality = local_108;
              end._M_current[lVar27].row_ep_norm2 = dVar2;
              end._M_current[lVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar4;
              end._M_current[lVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar10;
              end._M_current[lVar27].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar26;
            }
          }
        }
        else {
          begin = pFVar28;
          if (((undefined1  [16])pVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_c8 = pFVar28;
            local_b8 = param_4;
            local_b4 = param_3;
            if (local_e8._M_current + 1 != _Var19._M_current &&
                local_e8._M_current != _Var19._M_current) {
              lVar27 = 0;
              uVar22 = 0;
              pFVar20 = local_e8._M_current + 1;
              do {
                pFVar28 = pFVar20;
                local_d0 = _Var21._M_current[1].score;
                if ((_Var21._M_current)->score <= local_d0 && local_d0 != (_Var21._M_current)->score
                   ) {
                  local_108 = pFVar28->fractionality;
                  uStack_100 = SUB84(pFVar28->row_ep_norm2,0);
                  uStack_fc = (undefined4)((ulong)pFVar28->row_ep_norm2 >> 0x20);
                  local_78 = (pointer)CONCAT44(local_78._4_4_,_Var21._M_current[1].basisIndex);
                  local_68 = _Var21._M_current[1].row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppStack_60 = _Var21._M_current[1].row_ep.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                  local_a8 = (FractionalInteger *)
                             _Var21._M_current[1].row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  _Var21._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  _Var21._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  _Var21._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  lVar31 = lVar27;
                  _Var21._M_current = pFVar28;
                  do {
                    pFVar20 = _Var21._M_current;
                    dVar2 = pFVar20[-1].fractionality;
                    dVar8 = pFVar20[-1].row_ep_norm2;
                    uVar9 = *(undefined8 *)((long)&pFVar20[-1].score + 4);
                    ppVar4 = pFVar20[-1].row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    ppVar10 = pFVar20[-1].row_ep.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    *(undefined8 *)((long)&pFVar20->row_ep_norm2 + 4) =
                         *(undefined8 *)((long)&pFVar20[-1].row_ep_norm2 + 4);
                    *(undefined8 *)((long)&pFVar20->score + 4) = uVar9;
                    pFVar20->fractionality = dVar2;
                    pFVar20->row_ep_norm2 = dVar8;
                    ppVar26 = (pFVar20->row_ep).
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    (pFVar20->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = ppVar4;
                    (pFVar20->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
                    (pFVar20->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         pFVar20[-1].row_ep.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    pFVar20[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    pFVar20[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    pFVar20[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if (ppVar26 != (pointer)0x0) {
                      operator_delete(ppVar26);
                    }
                    _Var21._M_current = local_e8._M_current;
                    if (lVar31 == 0) break;
                    _Var21._M_current = pFVar20 + -1;
                    lVar31 = lVar31 + 0x38;
                  } while (pFVar20[-2].score <= local_d0 && local_d0 != pFVar20[-2].score);
                  (_Var21._M_current)->fractionality = local_108;
                  (_Var21._M_current)->row_ep_norm2 = (double)CONCAT44(uStack_fc,uStack_100);
                  pFVar20[-1].score = local_d0;
                  pFVar20[-1].basisIndex = (HighsInt)local_78;
                  ppVar26 = pFVar20[-1].row_ep.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pFVar20[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = local_68;
                  pFVar20[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = ppStack_60;
                  pFVar20[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
                  if (ppVar26 != (pointer)0x0) {
                    operator_delete(ppVar26);
                  }
                  uVar22 = uVar22 + ((long)pFVar28 - (long)_Var21._M_current >> 3) *
                                    0x6db6db6db6db6db7;
                  begin = local_c8;
                  _Var19._M_current = local_c0;
                  end._M_current = local_b0;
                  pFVar20 = local_98;
                  param_4 = local_b8;
                  param_3 = local_b4;
                  if (8 < uVar22) goto LAB_002edcdb;
                }
                lVar27 = lVar27 + -0x38;
                pFVar20 = pFVar28 + 1;
                _Var21._M_current = pFVar28;
              } while (pFVar28 + 1 != _Var19._M_current);
            }
            if (local_c8 == end._M_current) {
              return;
            }
            pFVar28 = _Var19._M_current + 2;
            if (pFVar28 == end._M_current) {
              return;
            }
            lVar27 = 0x70;
            lVar31 = 0;
            ppVar26 = (pointer)0x0;
            pFVar20 = local_c8;
            do {
              local_a8 = (FractionalInteger *)((long)&(_Var19._M_current)->fractionality + lVar27);
              local_d0 = pFVar20[1].score;
              if (pFVar20->score <= local_d0 && local_d0 != pFVar20->score) {
                local_108 = local_a8->fractionality;
                uStack_100 = SUB84(local_a8->row_ep_norm2,0);
                uStack_fc = (undefined4)((ulong)local_a8->row_ep_norm2 >> 0x20);
                local_9c = pFVar20[1].basisIndex;
                local_78 = pFVar20[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppStack_70 = pFVar20[1].row_ep.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                local_38 = pFVar20[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pFVar20[1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                pFVar20[1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                pFVar20[1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar32 = lVar31;
                pFVar20 = pFVar28;
                local_68 = ppVar26;
                do {
                  pFVar24 = pFVar20;
                  dVar2 = pFVar24[-1].fractionality;
                  dVar8 = pFVar24[-1].row_ep_norm2;
                  uVar9 = *(undefined8 *)((long)&pFVar24[-1].score + 4);
                  ppVar4 = pFVar24[-1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar10 = pFVar24[-1].row_ep.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  *(undefined8 *)((long)&pFVar24->row_ep_norm2 + 4) =
                       *(undefined8 *)((long)&pFVar24[-1].row_ep_norm2 + 4);
                  *(undefined8 *)((long)&pFVar24->score + 4) = uVar9;
                  pFVar24->fractionality = dVar2;
                  pFVar24->row_ep_norm2 = dVar8;
                  ppVar26 = (pFVar24->row_ep).
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  (pFVar24->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = ppVar4;
                  (pFVar24->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
                  (pFVar24->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       pFVar24[-1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pFVar24[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  pFVar24[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  pFVar24[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (ppVar26 != (pointer)0x0) {
                    operator_delete(ppVar26);
                  }
                  pFVar20 = local_c8;
                  if (lVar32 == 0) break;
                  pFVar20 = pFVar24 + -1;
                  lVar32 = lVar32 + 0x38;
                } while (pFVar24[-2].score <= local_d0 && local_d0 != pFVar24[-2].score);
                pFVar20->fractionality = local_108;
                pFVar20->row_ep_norm2 = (double)CONCAT44(uStack_fc,uStack_100);
                pFVar24[-1].score = local_d0;
                pFVar24[-1].basisIndex = local_9c;
                ppVar26 = pFVar24[-1].row_ep.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pFVar24[-1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start = local_78;
                pFVar24[-1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppStack_70;
                pFVar24[-1].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
                if (ppVar26 != (pointer)0x0) {
                  operator_delete(ppVar26);
                }
                ppVar26 = (pointer)((long)local_68 +
                                   ((long)local_a8 - (long)pFVar20 >> 3) * 0x6db6db6db6db6db7);
                begin = local_c8;
                _Var19._M_current = local_c0;
                end._M_current = local_b0;
                pFVar20 = local_98;
                param_4 = local_b8;
                param_3 = local_b4;
                if ((pointer)0x8 < ppVar26) break;
              }
              pFVar20 = local_a8;
              pFVar24 = (FractionalInteger *)((long)&_Var19._M_current[1].fractionality + lVar27);
              lVar27 = lVar27 + 0x38;
              pFVar28 = pFVar28 + 1;
              lVar31 = lVar31 + -0x38;
              if (pFVar24 == end._M_current) {
                return;
              }
            } while( true );
          }
        }
LAB_002edcdb:
        pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>,true>
                  (local_e8._M_current,local_c0,param_3,param_4 & 1);
        param_4 = 0;
        uVar22 = local_80;
      }
      else {
        _Var21 = partition_left<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
                           (begin,end._M_current);
        begin = _Var21._M_current + 1;
        uVar22 = (long)end._M_current - (long)begin;
      }
    } while (0x53f < (long)uVar22);
    if ((param_4 & 1) == 0) goto LAB_002edd14;
  }
  if (begin + 1 != end._M_current && begin != end._M_current) {
    lVar27 = 0;
    pFVar20 = begin + 1;
    local_c8 = begin;
    do {
      pFVar28 = pFVar20;
      local_d0 = begin[1].score;
      if (begin->score <= local_d0 && local_d0 != begin->score) {
        local_108 = pFVar28->fractionality;
        uStack_100 = SUB84(pFVar28->row_ep_norm2,0);
        uStack_fc = (undefined4)((ulong)pFVar28->row_ep_norm2 >> 0x20);
        HVar3 = begin[1].basisIndex;
        local_e8._M_current =
             (FractionalInteger *)
             begin[1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ppStack_e0 = begin[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        ppVar26 = begin[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        begin[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        begin[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        begin[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar20 = pFVar28;
        lVar31 = lVar27;
        do {
          pFVar24 = pFVar20;
          dVar2 = pFVar24[-1].fractionality;
          dVar8 = pFVar24[-1].row_ep_norm2;
          uVar9 = *(undefined8 *)((long)&pFVar24[-1].score + 4);
          ppVar10 = pFVar24[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar11 = pFVar24[-1].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          *(undefined8 *)((long)&pFVar24->row_ep_norm2 + 4) =
               *(undefined8 *)((long)&pFVar24[-1].row_ep_norm2 + 4);
          *(undefined8 *)((long)&pFVar24->score + 4) = uVar9;
          pFVar24->fractionality = dVar2;
          pFVar24->row_ep_norm2 = dVar8;
          ppVar4 = (pFVar24->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (pFVar24->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = ppVar10;
          (pFVar24->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar11;
          (pFVar24->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               pFVar24[-1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          pFVar24[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pFVar24[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pFVar24[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppVar4 != (pointer)0x0) {
            operator_delete(ppVar4);
          }
          pFVar20 = local_c8;
          if (lVar31 == 0) break;
          pFVar20 = pFVar24 + -1;
          lVar31 = lVar31 + 0x38;
        } while (pFVar24[-2].score <= local_d0 && local_d0 != pFVar24[-2].score);
        pFVar20->fractionality = local_108;
        pFVar20->row_ep_norm2 = (double)CONCAT44(uStack_fc,uStack_100);
        pFVar24[-1].score = local_d0;
        pFVar24[-1].basisIndex = HVar3;
        ppVar4 = pFVar24[-1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar24[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)local_e8._M_current;
        pFVar24[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppStack_e0;
        pFVar24[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar26;
        end._M_current = local_b0;
        if (ppVar4 != (pointer)0x0) {
          operator_delete(ppVar4);
          end._M_current = local_b0;
        }
      }
      lVar27 = lVar27 + -0x38;
      pFVar20 = pFVar28 + 1;
      begin = pFVar28;
    } while (pFVar28 + 1 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }